

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variablesio.cpp
# Opt level: O0

VariablesArray * __thiscall
bal::VariableTextReader::read_variable_value
          (VariablesArray *__return_storage_ptr__,VariableTextReader *this)

{
  bool bVar1;
  variableid_t local_34;
  undefined1 auStack_30 [4];
  variableid_t element_size;
  Container<unsigned_int> value;
  bool is_value_bracket;
  VariableTextReader *this_local;
  
  value.allocated_size_._3_1_ = 0;
  bVar1 = TextReader::is_symbol
                    ((TextReader *)
                     ((long)&this->_vptr_VariableTextReader +
                     (long)this->_vptr_VariableTextReader[-3]),'{');
  if (bVar1) {
    TextReader::skip_symbol
              ((TextReader *)
               ((long)&this->_vptr_VariableTextReader + (long)this->_vptr_VariableTextReader[-3]));
    TextReader::skip_space
              ((TextReader *)
               ((long)&this->_vptr_VariableTextReader + (long)this->_vptr_VariableTextReader[-3]));
    value.allocated_size_._3_1_ = 1;
  }
  Container<unsigned_int>::Container((Container<unsigned_int> *)auStack_30);
  local_34 = 0;
  read_variable_element_(this,(Container<unsigned_int> *)auStack_30,&local_34);
  if ((value.allocated_size_._3_1_ & 1) != 0) {
    TextReader::skip_space
              ((TextReader *)
               ((long)&this->_vptr_VariableTextReader + (long)this->_vptr_VariableTextReader[-3]));
    while (bVar1 = TextReader::is_symbol
                             ((TextReader *)
                              ((long)&this->_vptr_VariableTextReader +
                              (long)this->_vptr_VariableTextReader[-3]),','), bVar1) {
      TextReader::skip_symbol
                ((TextReader *)
                 ((long)&this->_vptr_VariableTextReader + (long)this->_vptr_VariableTextReader[-3]))
      ;
      TextReader::skip_space
                ((TextReader *)
                 ((long)&this->_vptr_VariableTextReader + (long)this->_vptr_VariableTextReader[-3]))
      ;
      read_variable_element_(this,(Container<unsigned_int> *)auStack_30,&local_34);
      TextReader::skip_space
                ((TextReader *)
                 ((long)&this->_vptr_VariableTextReader + (long)this->_vptr_VariableTextReader[-3]))
      ;
    }
    TextReader::read_symbol
              ((TextReader *)
               ((long)&this->_vptr_VariableTextReader + (long)this->_vptr_VariableTextReader[-3]),
               '}');
    TextReader::skip_space
              ((TextReader *)
               ((long)&this->_vptr_VariableTextReader + (long)this->_vptr_VariableTextReader[-3]));
  }
  read_variable_elements_sequence_
            (this,(Container<unsigned_int> *)auStack_30,(variableid_t)value.data_);
  VariablesArray::VariablesArray
            (__return_storage_ptr__,(variableid_t)value.data_ / local_34,local_34,_auStack_30);
  Container<unsigned_int>::~Container((Container<unsigned_int> *)auStack_30);
  return __return_storage_ptr__;
}

Assistant:

VariablesArray VariableTextReader::read_variable_value() {
        bool is_value_bracket = false;
        if (is_symbol('{')) {
            skip_symbol();
            skip_space();
            is_value_bracket = true;
        };
        
        Container<literalid_t> value;

        // the first element
        variableid_t element_size = 0;
        read_variable_element_(value, element_size);
        
        if (is_value_bracket) {
            // read more elements
            skip_space();
            while (is_symbol(',')) {
                skip_symbol();
                skip_space();
                read_variable_element_(value, element_size);
                skip_space();
            };
            
            read_symbol('}');
            skip_space();
        };
        
        read_variable_elements_sequence_(value, value.size_);
        
        return VariablesArray(value.size_ / element_size, element_size, value.data_);
    }